

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int get_int_attr(attr_list l,atom_t attr_id,int *valp)

{
  int iVar1;
  float *in_RDX;
  int ret;
  attr_union v;
  attr_value_type t;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  atom_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = query_pattr((attr_list)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd4,
                      (attr_value_type *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (attr_union *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    switch(in_stack_ffffffffffffffdc) {
    case 1:
      *in_RDX = in_stack_ffffffffffffffc8;
      *in_RDX = in_stack_ffffffffffffffc8;
      break;
    case 2:
      *in_RDX = in_stack_ffffffffffffffc8;
      *in_RDX = in_stack_ffffffffffffffc8;
      break;
    default:
      return 0;
    case 7:
      break;
    case 8:
      *in_RDX = (float)(int)(double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      break;
    case 9:
      *in_RDX = (float)(int)in_stack_ffffffffffffffc8;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
get_int_attr(attr_list l, atom_t attr_id, int *valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_Int4:
	if (sizeof(int) == 4) *valp = v.u.i;
	*valp = v.u.i;
	break;
    case Attr_Int8:
	if (sizeof(size_t) == 8) *valp = (int)v.u.l;
	*valp = v.u.i;
	break;
    case Attr_Float16:
	if (sizeof(double) == 16) *valp = (int)v.u.d;
	if (sizeof(float) == 16) *valp = (int)v.u.f;
	break;
    case Attr_Float8:
	if (sizeof(double) == 8) *valp = (int)v.u.d;
	if (sizeof(float) == 8) *valp = (int)v.u.f;
	break;
    case Attr_Float4:
	if (sizeof(double) == 4) *valp = (int)v.u.d;
	if (sizeof(float) == 4) *valp = (int)v.u.f;
	break;
    default:
	return 0;
    }
    return 1;
}